

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall
wabt::WastLexer::GetNumberToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  char *pcVar1;
  bool bVar2;
  byte *pbVar3;
  uint c;
  
  bVar2 = ReadNum(this);
  if (bVar2) {
    pbVar3 = (byte *)this->cursor_;
    if ((pbVar3 < this->buffer_end_) && (*pbVar3 == 0x2e)) {
      pbVar3 = pbVar3 + 1;
      this->cursor_ = (char *)pbVar3;
      if (pbVar3 < this->buffer_end_) {
        c = (uint)*pbVar3;
      }
      else {
        c = 0xffffffff;
      }
      bVar2 = IsDigit(c);
      token_type = First_Literal;
      if ((bVar2) && (bVar2 = ReadNum(this), !bVar2)) goto LAB_0016d401;
    }
    pcVar1 = this->cursor_;
    if ((pcVar1 < this->buffer_end_) && ((*pcVar1 == 'e' || (*pcVar1 == 'E')))) {
      this->cursor_ = pcVar1 + 1;
      ReadSign(this);
      bVar2 = ReadNum(this);
      if (!bVar2) goto LAB_0016d401;
      token_type = First_Literal;
    }
    bVar2 = NoTrailingReservedChars(this);
    if (bVar2) {
      bVar2 = token_type == First_Literal;
      if (bVar2) {
        token_type = First_Literal;
      }
      LiteralToken(__return_storage_ptr__,this,token_type,(uint)bVar2);
      return __return_storage_ptr__;
    }
  }
LAB_0016d401:
  GetReservedToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNumberToken(TokenType token_type) {
  if (ReadNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsDigit(PeekChar()) && !ReadNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('e') || MatchChar('E')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Float);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}